

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall
QColumnView::setSelectionModel(QColumnView *this,QItemSelectionModel *newSelectionModel)

{
  long lVar1;
  long *plVar2;
  QItemSelectionModel *pQVar3;
  QItemSelectionModel *pQVar4;
  int i;
  ulong uVar5;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  uVar5 = 0;
  do {
    if (*(ulong *)(lVar1 + 0x550) <= uVar5) goto LAB_0050afaf;
    pQVar3 = QAbstractItemView::selectionModel
                       (*(QAbstractItemView **)(*(long *)(lVar1 + 0x548) + uVar5 * 8));
    pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
    uVar5 = uVar5 + 1;
  } while (pQVar3 != pQVar4);
  plVar2 = *(long **)(*(long *)(lVar1 + 0x548) + -8 + uVar5 * 8);
  (**(code **)(*plVar2 + 0x1d0))(plVar2,newSelectionModel);
LAB_0050afaf:
  QAbstractItemView::setSelectionModel((QAbstractItemView *)this,newSelectionModel);
  return;
}

Assistant:

void QColumnView::setSelectionModel(QItemSelectionModel *newSelectionModel)
{
    Q_D(const QColumnView);
    for (int i = 0; i < d->columns.size(); ++i) {
        if (d->columns.at(i)->selectionModel() == selectionModel()) {
            d->columns.at(i)->setSelectionModel(newSelectionModel);
            break;
        }
    }
    QAbstractItemView::setSelectionModel(newSelectionModel);
}